

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atan.c
# Opt level: O0

double c_atan(double x)

{
  double x_00;
  double dVar1;
  double dVar2;
  short local_2c;
  short local_2a;
  short flag;
  double dStack_28;
  short sign;
  double z;
  double y;
  double x_local;
  
  if ((x != 0.0) || (x_local = x, NAN(x))) {
    if ((x != INFINITY) || (NAN(x) || NAN(INFINITY))) {
      if ((x != -INFINITY) || (NAN(x) || NAN(-INFINITY))) {
        local_2a = 1;
        y = x;
        if (x < 0.0) {
          local_2a = -1;
          y = -x;
        }
        local_2c = 0;
        if (y <= T3P8) {
          if (0.66 < y) {
            z = PIO4;
            local_2c = 2;
            y = (y - 1.0) / (y + 1.0);
          }
          else {
            z = 0.0;
          }
        }
        else {
          z = PIO2;
          local_2c = 1;
          y = -(1.0 / y);
        }
        x_00 = y * y;
        dVar1 = polevl(x_00,P,4);
        dVar2 = p1evl(x_00,Q,5);
        dStack_28 = y * ((x_00 * dVar1) / dVar2) + y;
        if (local_2c == 2) {
          dStack_28 = dStack_28 + 3.061616997868383e-17;
        }
        else if (local_2c == 1) {
          dStack_28 = dStack_28 + 6.123233995736766e-17;
        }
        z = z + dStack_28;
        if (local_2a < 0) {
          z = -z;
        }
        x_local = z;
      }
      else {
        x_local = -PIO2;
      }
    }
    else {
      x_local = PIO2;
    }
  }
  return x_local;
}

Assistant:

double c_atan(x)
double x;
{
double y, z;
short sign, flag;

#ifdef MINUSZERO
if( x == 0.0 )
	return(x);
#endif
#ifdef INFINITIES
if(x == INFINITY)
	return(PIO2);
if(x == -INFINITY)
	return(-PIO2);
#endif
/* make argument positive and save the sign */
sign = 1;
if( x < 0.0 )
	{
	sign = -1;
	x = -x;
	}
/* range reduction */
flag = 0;
if( x > T3P8 )
	{
	y = PIO2;
	flag = 1;
	x = -( 1.0/x );
	}
else if( x <= 0.66 )
	{
	y = 0.0;
	}
else
	{
	y = PIO4;
	flag = 2;
	x = (x-1.0)/(x+1.0);
	}
z = x * x;
z = z * polevl( z, P, 4 ) / p1evl( z, Q, 5 );
z = x * z + x;
if( flag == 2 )
	z += 0.5 * MOREBITS;
else if( flag == 1 )
	z += MOREBITS;
y = y + z;
if( sign < 0 )
	y = -y;
return(y);
}